

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm::forward_int8
          (Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  void *pvVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  size_t *psVar10;
  uint uVar11;
  long lVar12;
  pointer pMVar13;
  size_t sVar14;
  Mat *pMVar15;
  uint uVar16;
  long lVar17;
  pointer pMVar18;
  uint uVar19;
  ulong uVar20;
  float *pfVar21;
  int *piVar22;
  void *pvVar23;
  void *pvVar24;
  Allocator **ppAVar25;
  int iVar26;
  uint uVar27;
  Mat *pMVar28;
  long lVar29;
  Allocator *pAVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  long local_258;
  Mat local_238;
  Mat local_1e8;
  int local_19c;
  Mat local_198;
  Mat local_150;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Allocator *local_d0;
  size_t *local_c8;
  int *local_c0;
  long local_b8;
  void *local_b0;
  void *local_a8;
  Mat *local_a0;
  long local_98;
  Mat local_90;
  undefined1 local_48 [16];
  
  if (this->constantA == 0) {
    pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this->constantB != 0) goto LAB_00478b36;
    pMVar28 = pMVar15 + 1;
  }
  else {
    pMVar15 = &this->A_data;
    if (this->constantB == 0) {
      pMVar28 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
LAB_00478b36:
      pMVar28 = &this->B_data;
    }
  }
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  if (this->transA == 0) {
    if (&local_238 == pMVar15) {
      local_150.h = 0;
      local_150.w = 0;
    }
    else {
      piVar22 = pMVar15->refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      local_238.data = pMVar15->data;
      local_238.refcount._0_4_ = SUB84(pMVar15->refcount,0);
      local_238.refcount._4_4_ = (undefined4)((ulong)pMVar15->refcount >> 0x20);
      local_238.elemsize._0_4_ = (undefined4)pMVar15->elemsize;
      local_238.elemsize._4_4_ = (undefined4)(pMVar15->elemsize >> 0x20);
      local_238.elempack = pMVar15->elempack;
      local_238.allocator = pMVar15->allocator;
      uVar3 = pMVar15->dims;
      uVar4 = pMVar15->w;
      uVar5 = pMVar15->h;
      uVar6 = pMVar15->d;
      local_238.w = uVar4;
      local_238.h = uVar5;
      local_238.d = uVar6;
      local_238.c = pMVar15->c;
      local_238.cstep = pMVar15->cstep;
      local_150.h = pMVar15->h;
      local_150.w = pMVar15->w;
      local_238.dims = uVar3;
    }
  }
  else if (pMVar15->elemsize == 1) {
    Mat::create(&local_238,pMVar15->h,pMVar15->w,1,1,opt->workspace_allocator);
    uVar9 = (ulong)(uint)local_238.w;
    local_150.h = local_238.h;
    local_150.w = local_238.w;
    if (0 < local_238.h) {
      lVar12 = 0;
      do {
        iVar26 = (int)uVar9;
        if (0 < iVar26) {
          lVar17 = 0;
          do {
            *(undefined1 *)
             ((long)local_238.data +
             lVar17 + CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) * lVar12 *
                      (long)iVar26) =
                 *(undefined1 *)
                  ((long)pMVar15->data + lVar12 + pMVar15->w * lVar17 * pMVar15->elemsize);
            lVar17 = lVar17 + 1;
            uVar9 = (ulong)local_238.w;
          } while (lVar17 < (long)uVar9);
        }
        local_150.w = (int)uVar9;
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_238.h);
    }
  }
  else {
    Mat::create(&local_238,(&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2],pMVar15->w,4,1,
                opt->workspace_allocator);
    local_150.h = local_238.h;
    local_150.w = local_238.w;
    if (0 < (long)local_238.h) {
      lVar12 = 0;
      pvVar23 = local_238.data;
      do {
        if (0 < local_238.w) {
          iVar26 = pMVar15->dims;
          sVar7 = pMVar15->elemsize;
          pvVar2 = pMVar15->data;
          uVar9 = 0;
          do {
            if (iVar26 == 3) {
              sVar14 = pMVar15->cstep;
            }
            else {
              sVar14 = (size_t)pMVar15->w;
            }
            *(undefined4 *)((long)pvVar23 + uVar9 * 4) =
                 *(undefined4 *)((long)pvVar2 + sVar14 * uVar9 * sVar7 + lVar12 * 4);
            uVar9 = uVar9 + 1;
          } while ((uint)local_238.w != uVar9);
        }
        lVar12 = lVar12 + 1;
        pvVar23 = (void *)((long)pvVar23 +
                          (long)local_238.w *
                          CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize));
      } while (lVar12 != local_238.h);
    }
  }
  local_150.refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  local_150.data = local_238.data;
  local_150.elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
  local_150.elempack = local_238.elempack;
  local_150.allocator = local_238.allocator;
  local_150.dims = local_238.dims;
  local_150.c = local_238.c;
  local_150.d = local_238.d;
  local_150.cstep = local_238.cstep;
  if (local_150.refcount != (int *)0x0) {
    LOCK();
    *local_150.refcount = *local_150.refcount + 1;
    UNLOCK();
  }
  local_90.data = (this->A_data_int8_scales).data;
  local_90.refcount = (this->A_data_int8_scales).refcount;
  local_90.elemsize = (this->A_data_int8_scales).elemsize;
  local_90.elempack = (this->A_data_int8_scales).elempack;
  local_90.allocator = (this->A_data_int8_scales).allocator;
  local_90.dims = (this->A_data_int8_scales).dims;
  local_90.w = (this->A_data_int8_scales).w;
  local_90.h = (this->A_data_int8_scales).h;
  local_90.d = (this->A_data_int8_scales).d;
  local_90.c = (this->A_data_int8_scales).c;
  local_90.cstep = (this->A_data_int8_scales).cstep;
  if (local_90.refcount != (int *)0x0) {
    LOCK();
    *local_90.refcount = *local_90.refcount + 1;
    UNLOCK();
  }
  if (local_150.elemsize != 1) {
    Mat::create(&local_150,local_238.w,(&local_238.h)[(ulong)(local_238.dims == 3) * 2],1,1,
                opt->workspace_allocator);
    Mat::create(&local_90,local_150.h,4,1,opt->workspace_allocator);
    if (0 < local_150.h) {
      uVar9 = (ulong)(uint)local_150.w;
      lVar12 = 0;
      uVar19 = local_150.h;
      do {
        pvVar2 = local_150.data;
        pvVar23 = local_238.data;
        psVar10 = (size_t *)&local_238.w;
        if (local_238.dims == 3) {
          psVar10 = &local_238.cstep;
        }
        sVar7 = *psVar10;
        fVar33 = 0.0;
        iVar26 = (int)uVar9;
        fVar32 = 0.0;
        if (0 < iVar26) {
          uVar20 = 0;
          do {
            fVar32 = ABS(*(float *)((long)local_238.data +
                                   uVar20 * 4 + (long)((int)sVar7 * (int)lVar12) * 4));
            if (fVar33 <= fVar32) {
              fVar33 = fVar32;
            }
            uVar20 = uVar20 + 1;
            fVar32 = fVar33;
          } while ((uVar9 & 0xffffffff) != uVar20);
        }
        fVar33 = (float)(-(uint)(fVar32 == 0.0) & 0x3f800000 |
                        ~-(uint)(fVar32 == 0.0) & (uint)(127.0 / fVar32));
        *(float *)((long)local_90.data + lVar12 * 4) = fVar33;
        if (0 < iVar26) {
          lVar17 = local_150.elemsize * lVar12;
          lVar31 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0;
          uStack_dc = 0;
          local_e8 = fVar33;
          do {
            fVar33 = roundf(*(float *)((long)pvVar23 +
                                      lVar31 * 4 + (long)((int)sVar7 * (int)lVar12) * 4) * local_e8)
            ;
            iVar8 = (int)fVar33;
            if (iVar8 < -0x7e) {
              iVar8 = -0x7f;
            }
            if (0x7e < iVar8) {
              iVar8 = 0x7f;
            }
            *(char *)((long)pvVar2 + lVar31 + lVar17 * iVar26) = (char)iVar8;
            lVar31 = lVar31 + 1;
            uVar9 = (ulong)local_150.w;
            uVar19 = local_150.h;
          } while (lVar31 < (long)uVar9);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)uVar19);
    }
  }
  local_1e8.data = pMVar28->data;
  local_1e8.refcount = pMVar28->refcount;
  local_1e8.elemsize = pMVar28->elemsize;
  local_1e8.elempack = pMVar28->elempack;
  local_1e8.allocator = pMVar28->allocator;
  local_1e8.dims = pMVar28->dims;
  local_1e8.w = pMVar28->w;
  local_1e8.h = pMVar28->h;
  local_1e8.d = pMVar28->d;
  local_1e8.c = pMVar28->c;
  local_1e8.cstep = pMVar28->cstep;
  if (local_1e8.refcount != (int *)0x0) {
    LOCK();
    *local_1e8.refcount = *local_1e8.refcount + 1;
    UNLOCK();
  }
  if (local_1e8.elemsize == 1) {
    local_108 = ZEXT416((uint)this->B_data_int8_scale);
  }
  else {
    Mat::create(&local_1e8,pMVar28->w,(&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2],1,1,
                opt->workspace_allocator);
    if (local_1e8.h < 1) {
      local_108._0_12_ = ZEXT812(0x3f800000);
      local_108._12_4_ = 0;
    }
    else {
      fVar33 = 0.0;
      iVar26 = 0;
      do {
        if (pMVar28->dims == 3) {
          iVar8 = (int)pMVar28->cstep;
        }
        else {
          iVar8 = pMVar28->w;
        }
        if (0 < local_1e8.w) {
          uVar9 = 0;
          do {
            fVar32 = ABS(*(float *)((long)pMVar28->data + uVar9 * 4 + (long)(iVar8 * iVar26) * 4));
            if (fVar33 <= fVar32) {
              fVar33 = fVar32;
            }
            uVar9 = uVar9 + 1;
          } while ((uint)local_1e8.w != uVar9);
        }
        iVar26 = iVar26 + 1;
      } while (iVar26 != local_1e8.h);
      local_108 = ZEXT416(-(uint)(fVar33 == 0.0) & 0x3f800000 |
                          ~-(uint)(fVar33 == 0.0) & (uint)(127.0 / fVar33));
      if (0 < local_1e8.h) {
        lVar12 = 0;
        iVar26 = local_1e8.h;
        do {
          pvVar23 = local_1e8.data;
          if (pMVar28->dims == 3) {
            iVar8 = (int)pMVar28->cstep;
          }
          else {
            iVar8 = pMVar28->w;
          }
          lVar17 = (long)local_1e8.w;
          if (0 < lVar17) {
            pvVar2 = pMVar28->data;
            lVar29 = local_1e8.elemsize * lVar12;
            lVar31 = 0;
            do {
              fVar33 = roundf(*(float *)((long)pvVar2 + lVar31 * 4 + (long)(iVar8 * (int)lVar12) * 4
                                        ) * (float)local_108._0_4_);
              iVar26 = (int)fVar33;
              if (iVar26 < -0x7e) {
                iVar26 = -0x7f;
              }
              if (0x7e < iVar26) {
                iVar26 = 0x7f;
              }
              *(char *)((long)pvVar23 + lVar31 + lVar29 * lVar17) = (char)iVar26;
              lVar31 = lVar31 + 1;
            } while (lVar31 < local_1e8.w);
            iVar26 = local_1e8.h;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar26);
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_198,local_1e8.h,local_1e8.w,1,1,opt->workspace_allocator);
    if (0 < local_198.h) {
      uVar9 = (ulong)(uint)local_198.w;
      lVar12 = 0;
      do {
        iVar26 = (int)uVar9;
        if (0 < iVar26) {
          lVar17 = 0;
          do {
            *(undefined1 *)
             ((long)local_198.data +
             lVar17 + CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) * lVar12 *
                      (long)iVar26) =
                 *(undefined1 *)
                  ((long)local_1e8.data + lVar12 + local_1e8.w * lVar17 * local_1e8.elemsize);
            lVar17 = lVar17 + 1;
            uVar9 = (ulong)local_198.w;
          } while (lVar17 < (long)uVar9);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_198.h);
    }
  }
  else {
    if (local_1e8.refcount != (int *)0x0) {
      LOCK();
      *local_1e8.refcount = *local_1e8.refcount + 1;
      UNLOCK();
    }
    local_198.data = local_1e8.data;
    local_198.refcount._0_4_ = SUB84(local_1e8.refcount,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)local_1e8.refcount >> 0x20);
    local_198.elemsize._0_4_ = (undefined4)local_1e8.elemsize;
    local_198.elemsize._4_4_ = (undefined4)(local_1e8.elemsize >> 0x20);
    local_198.elempack = local_1e8.elempack;
    local_198.allocator = local_1e8.allocator;
    local_198.dims = local_1e8.dims;
    local_198.d = local_1e8.d;
    local_198.c = local_1e8.c;
    local_198.cstep = local_1e8.cstep;
    local_198.w = local_1e8.w;
    local_198.h = local_1e8.h;
  }
  if (this->constantC != 0) {
    piVar22 = (this->C_data).refcount;
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + 1;
      UNLOCK();
    }
    local_f8._0_8_ = (this->C_data).data;
    local_f8._8_8_ = (this->C_data).refcount;
    pAVar30 = (this->C_data).allocator;
    uVar19 = this->constant_broadcast_type_C;
    goto LAB_004793f5;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (this->constantA != 0 || this->constantB != 0) {
LAB_00479751:
      if ((long)pMVar13 - (long)pMVar18 == 0x90) {
        piVar22 = pMVar18[1].refcount;
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + 1;
          UNLOCK();
        }
        pvVar23 = pMVar18[1].data;
        local_f8._0_8_ = pMVar18[1].data;
        local_f8._8_8_ = pMVar18[1].refcount;
        ppAVar25 = &pMVar18[1].allocator;
        piVar22 = &pMVar18[1].c;
        psVar10 = &pMVar18[1].cstep;
        iVar26 = pMVar18[1].dims;
        uVar11 = pMVar18[1].w;
        uVar16 = pMVar18[1].h;
        goto LAB_004797e5;
      }
    }
    if ((long)pMVar13 - (long)pMVar18 != 0xd8) {
      pAVar30 = (Allocator *)0x0;
      local_f8 = ZEXT816(0);
      uVar19 = 0;
      goto LAB_004793f5;
    }
    piVar22 = pMVar18[2].refcount;
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + 1;
      UNLOCK();
    }
    pvVar23 = pMVar18[2].data;
    local_f8._0_8_ = pMVar18[2].data;
    local_f8._8_8_ = pMVar18[2].refcount;
    ppAVar25 = &pMVar18[2].allocator;
    piVar22 = &pMVar18[2].c;
    psVar10 = &pMVar18[2].cstep;
    iVar26 = pMVar18[2].dims;
    uVar11 = pMVar18[2].w;
    uVar16 = pMVar18[2].h;
  }
  else {
    pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pMVar13 - (long)pMVar18 != 0x48) goto LAB_00479751;
    piVar22 = pMVar18->refcount;
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + 1;
      UNLOCK();
    }
    pvVar23 = pMVar18->data;
    local_f8._0_8_ = pMVar18->data;
    local_f8._8_8_ = pMVar18->refcount;
    ppAVar25 = &pMVar18->allocator;
    piVar22 = &pMVar18->c;
    psVar10 = &pMVar18->cstep;
    iVar26 = pMVar18->dims;
    uVar11 = pMVar18->w;
    uVar16 = pMVar18->h;
  }
LAB_004797e5:
  pAVar30 = *ppAVar25;
  uVar19 = 0;
  if ((pvVar23 != (void *)0x0) && ((long)*piVar22 * *psVar10 != 0)) {
    uVar19 = (uint)(uVar11 == local_150.h && iVar26 == 1);
    uVar27 = uVar19;
    if (uVar11 == local_198.h) {
      uVar27 = 4;
    }
    if (iVar26 != 1) {
      uVar27 = uVar19;
    }
    uVar19 = 2;
    if (uVar16 != local_150.h) {
      uVar19 = uVar27;
    }
    if (uVar11 != 1) {
      uVar19 = uVar27;
    }
    if (iVar26 != 2) {
      uVar19 = uVar27;
    }
    uVar27 = 3;
    if (uVar16 != local_150.h) {
      uVar27 = uVar19;
    }
    if (uVar11 != local_198.h) {
      uVar27 = uVar19;
    }
    if ((iVar26 == 2) && (uVar19 = uVar27, uVar16 == 1 && uVar11 == local_198.h)) {
      uVar19 = 4;
    }
  }
LAB_004793f5:
  pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = local_198.h;
  uVar16 = local_150.h;
  if (this->output_transpose == 0) {
    uVar11 = local_150.h;
    uVar16 = local_198.h;
  }
  local_48._8_4_ = local_f8._8_4_;
  local_48._12_4_ = local_f8._12_4_;
  local_48._0_8_ = local_f8._8_8_;
  if (this->output_N1M == 0) {
    Mat::create(pMVar15,uVar16,uVar11,4,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar15,uVar16,1,uVar11,4,opt->blob_allocator);
  }
  iVar26 = -100;
  if ((pMVar15->data != (void *)0x0) && ((long)pMVar15->c * pMVar15->cstep != 0)) {
    if ((long)local_150.h < 1) {
      iVar26 = 0;
    }
    else {
      fVar33 = this->alpha;
      fVar32 = this->beta;
      local_a8 = local_90.data;
      local_e8 = (float)this->output_transpose;
      local_19c = pMVar15->dims;
      local_b0 = local_198.data;
      local_b8 = (long)local_198.h;
      local_98 = (long)local_150.w * local_150.elemsize;
      local_258 = 0;
      local_c0 = &pMVar15->w;
      local_c8 = &pMVar15->cstep;
      pvVar23 = local_150.data;
      do {
        if (0 < local_198.h) {
          fVar1 = *(float *)((long)local_90.data + local_258 * 4);
          psVar10 = (size_t *)local_c0;
          if (local_19c == 3) {
            psVar10 = local_c8;
          }
          sVar7 = *psVar10;
          pvVar2 = pMVar15->data;
          uVar9 = 0;
          pvVar24 = local_198.data;
          do {
            if (local_150.w < 1) {
              fVar34 = 0.0;
            }
            else {
              uVar20 = 0;
              iVar26 = 0;
              do {
                iVar26 = iVar26 + (int)*(char *)((long)pvVar24 + uVar20) *
                                  (int)*(char *)((long)pvVar23 + uVar20);
                uVar20 = uVar20 + 1;
              } while ((uint)local_150.w != uVar20);
              fVar34 = (float)iVar26;
            }
            fVar34 = fVar34 * (1.0 / (fVar1 * (float)local_108._0_4_));
            if ((float *)local_f8._0_8_ != (float *)0x0) {
              pfVar21 = (float *)local_f8._0_8_;
              switch(uVar19) {
              case 0:
                break;
              case 1:
              case 2:
                pfVar21 = (float *)(local_f8._0_8_ + local_258 * 4);
                break;
              case 3:
                pfVar21 = (float *)(local_f8._0_8_ + (local_258 * local_b8 + uVar9) * 4);
                break;
              case 4:
                pfVar21 = (float *)(local_f8._0_8_ + uVar9 * 4);
                break;
              default:
                fVar35 = 0.0;
                goto LAB_0047969b;
              }
              fVar35 = *pfVar21;
LAB_0047969b:
              fVar34 = fVar34 + fVar35 * fVar32;
            }
            lVar12 = uVar9 * (long)(int)sVar7 * 4 + local_258 * 4;
            if (local_e8 == 0.0) {
              lVar12 = uVar9 * 4 + local_258 * (int)sVar7 * 4;
            }
            *(float *)((long)pvVar2 + lVar12) = fVar34 * fVar33;
            uVar9 = uVar9 + 1;
            pvVar24 = (void *)((long)pvVar24 +
                              (long)local_198.w *
                              CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
          } while (uVar9 != (uint)local_198.h);
        }
        local_258 = local_258 + 1;
        pvVar23 = (void *)((long)pvVar23 + local_98);
      } while (local_258 != local_150.h);
      iVar26 = 0;
      local_d0 = pAVar30;
      local_a0 = pMVar15;
    }
  }
  if ((int *)local_48._0_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_48._0_8_ = *(int *)local_48._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_48._0_8_ == 0) {
      if (pAVar30 == (Allocator *)0x0) {
        if ((float *)local_f8._0_8_ != (float *)0x0) {
          free((void *)local_f8._0_8_);
        }
      }
      else {
        (*pAVar30->_vptr_Allocator[3])(pAVar30);
      }
    }
  }
  piVar22 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_1e8.refcount != (int *)0x0) {
    LOCK();
    *local_1e8.refcount = *local_1e8.refcount + -1;
    UNLOCK();
    if (*local_1e8.refcount == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_90.refcount != (int *)0x0) {
    LOCK();
    *local_90.refcount = *local_90.refcount + -1;
    UNLOCK();
    if (*local_90.refcount == 0) {
      if (local_90.allocator == (Allocator *)0x0) {
        if (local_90.data != (void *)0x0) {
          free(local_90.data);
        }
      }
      else {
        (*(local_90.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_150.refcount != (int *)0x0) {
    LOCK();
    *local_150.refcount = *local_150.refcount + -1;
    UNLOCK();
    if (*local_150.refcount == 0) {
      if (local_150.allocator == (Allocator *)0x0) {
        if (local_150.data != (void *)0x0) {
          free(local_150.data);
        }
      }
      else {
        (*(local_150.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar22 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int Gemm::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        if (A0.elemsize == 1)
        {
            A.create(A0.h, A0.w, (size_t)1u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                signed char* ptr = A.row<signed char>(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.row<const signed char>(j)[i];
                }
            }
        }
        else
        {
            A.create(A0.dims == 3 ? A0.c : A0.h, A0.w, (size_t)4u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                float* ptr = A.row(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.dims == 3 ? A0.channel(j)[i] : A0.row(j)[i];
                }
            }
        }
    }

    // dynamic quantize A
    Mat A_int8 = A;
    Mat A_int8_scales = A_data_int8_scales;
    if (A_int8.elemsize != 1)
    {
        A_int8.create(A.w, A.dims == 3 ? A.c : A.h, (size_t)1u, 1, opt.workspace_allocator);
        A_int8_scales.create(A_int8.h, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < A_int8.h; i++)
        {
            const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
            const float* ptr = (const float*)A + i * A_hstep;

            float absmax = 0.f;
            for (int k = 0; k < A_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }

            float A_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;
            A_int8_scales[i] = A_int8_scale;

            signed char* ptrAi = A_int8.row<signed char>(i);

            for (int k = 0; k < A_int8.w; k++)
            {
                ptrAi[k] = float2int8(ptr[k] * A_int8_scale);
            }
        }
    }

    // dynamic quantize B
    Mat B0_int8 = B0;
    float B_int8_scale = B_data_int8_scale;
    if (B0_int8.elemsize != 1)
    {
        B0_int8.create(B0.w, B0.dims == 3 ? B0.c : B0.h, (size_t)1u, 1, opt.workspace_allocator);

        float absmax = 0.f;
        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            for (int k = 0; k < B0_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }
        }

        B_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;

        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            signed char* ptrBi = B0_int8.row<signed char>(i);

            for (int k = 0; k < B0_int8.w; k++)
            {
                ptrBi[k] = float2int8(ptr[k] * B_int8_scale);
            }
        }
    }

    Mat BT_int8;
    if (transB == 0)
    {
        // transpose B to col-major
        BT_int8.create(B0_int8.h, B0_int8.w, (size_t)1u, 1, opt.workspace_allocator);

        for (int i = 0; i < BT_int8.h; i++)
        {
            signed char* ptr = BT_int8.row<signed char>(i);
            for (int j = 0; j < BT_int8.w; j++)
            {
                ptr[j] = B0_int8.row<const signed char>(j)[i];
            }
        }
    }
    else
    {
        BT_int8 = B0_int8;
    }

    const int M = A_int8.h;
    const int N = BT_int8.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, 4u, opt.blob_allocator);
        else
            top_blob.create(M, N, 4u, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, 4u, opt.blob_allocator);
        else
            top_blob.create(N, M, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB_int8(A_int8, BT_int8, A_int8_scales, B_int8_scale, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}